

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O0

void cinemo::wh::getFmtFromFileHandle(WaveHeader *wh,ifstream *file,header_pos dp)

{
  uint32_t uVar1;
  streamoff sVar2;
  undefined1 auVar3 [16];
  bool local_1ea;
  bool local_1da;
  bool local_1cc;
  allocator local_1c9;
  string local_1c8 [37];
  byte local_1a3;
  byte local_1a2;
  allocator local_1a1;
  string local_1a0 [35];
  byte local_17d;
  byte local_16a;
  allocator local_169;
  string local_168 [32];
  long local_148;
  long leftToRead;
  undefined8 local_138;
  long local_130;
  long readSoFar;
  char buff [256];
  ifstream *file_local;
  WaveHeader *wh_local;
  header_pos dp_local;
  
  wh_local._4_4_ = dp.second;
  std::istream::seekg((long)file,wh_local._4_4_);
  std::istream::read((char *)file,(long)&readSoFar);
  uVar1 = convert4CharTo16_BigEndian((char *)&readSoFar);
  wh->FormatSize = uVar1;
  std::istream::read((char *)file,(long)&wh->FormatAudioType);
  std::istream::read((char *)file,(long)&wh->NumberOfChannels);
  std::istream::read((char *)file,(long)&wh->SampleRate);
  std::istream::read((char *)file,(long)&wh->ByteRate);
  std::istream::read((char *)file,(long)&wh->BlockAlign);
  std::istream::read((char *)file,(long)&wh->BitsPerSample);
  auVar3 = std::istream::tellg();
  local_138 = auVar3._8_8_;
  leftToRead = auVar3._0_8_;
  sVar2 = std::fpos::operator_cast_to_long((fpos *)&leftToRead);
  local_130 = (sVar2 - (int)wh_local._4_4_) + -4;
  local_148 = (ulong)wh->FormatSize - local_130;
  if (local_148 == 0) {
    std::istream::read((char *)file,(long)&readSoFar);
    local_16a = 0;
    local_17d = 0;
    local_1cc = false;
    if ((wh->HasFact & 1U) == 0) {
      std::allocator<char>::allocator();
      local_16a = 1;
      std::__cxx11::string::string(local_168,(char *)&readSoFar,4,&local_169);
      local_17d = 1;
      local_1cc = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_168,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)WaveDataString_abi_cxx11_);
    }
    if ((local_17d & 1) != 0) {
      std::__cxx11::string::~string(local_168);
    }
    if ((local_16a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
    }
    if (local_1cc != false) {
      std::bitset<8UL>::set(&wh->WarningFlags,1,true);
    }
  }
  else if (local_148 == 2) {
    std::istream::read((char *)file,(long)&wh->ExtensionSize);
    std::istream::read((char *)file,(long)&readSoFar);
    local_1a2 = 0;
    local_1a3 = 0;
    local_1da = false;
    if ((wh->HasFact & 1U) == 0) {
      std::allocator<char>::allocator();
      local_1a2 = 1;
      std::__cxx11::string::string(local_1a0,(char *)&readSoFar,4,&local_1a1);
      local_1a3 = 1;
      local_1da = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)WaveDataString_abi_cxx11_);
    }
    if ((local_1a3 & 1) != 0) {
      std::__cxx11::string::~string(local_1a0);
    }
    if ((local_1a2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    }
    if (local_1da != false) {
      std::bitset<8UL>::set(&wh->WarningFlags,1,true);
    }
  }
  else {
    if ((wh->ExtensionSize == 0) || (wh->ExtensionSize == 0x16)) {
      if (wh->ExtensionSize == 0x16) {
        std::istream::read((char *)file,(long)&wh->ValidBitsPerSample);
        std::istream::read((char *)file,(long)&wh->ChannelMask);
        std::istream::read((char *)file,(long)wh->SubFormat);
      }
      else {
        std::istream::ignore((long)file);
      }
    }
    else {
      std::bitset<8UL>::set(&wh->WarningFlags,1,true);
    }
    std::istream::read((char *)file,(long)&readSoFar);
    local_1ea = false;
    if ((wh->HasFact & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,(char *)&readSoFar,4,&local_1c9);
      local_1ea = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1c8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)WaveDataString_abi_cxx11_);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    if (local_1ea != false) {
      std::bitset<8UL>::set(&wh->WarningFlags,1,true);
    }
  }
  return;
}

Assistant:

void getFmtFromFileHandle(WaveHeader* wh, std::ifstream& file,
                                  header_pos dp) {
            file.seekg(dp.second, std::ios::beg);
            char buff[WaveBufferSize];
            //get format size
            file.read(&buff[0], 4);
            wh->FormatSize = convert4CharTo16_BigEndian(&buff[0]);
            file.read(reinterpret_cast<char*>(&wh->FormatAudioType),
                      sizeof(wh->FormatAudioType));
            file.read(reinterpret_cast<char*>(&wh->NumberOfChannels),
                      sizeof(wh->NumberOfChannels));
            file.read(reinterpret_cast<char*>(&wh->SampleRate),
                      sizeof(wh->SampleRate));
            file.read(reinterpret_cast<char*>(&wh->ByteRate),
                      sizeof(wh->ByteRate));
            file.read(reinterpret_cast<char*>(&wh->BlockAlign),
                      sizeof(wh->BlockAlign));
            file.read(reinterpret_cast<char*>(&wh->BitsPerSample),
                      sizeof(wh->BitsPerSample));

            //check if file is standard fmt with 16 fmt bytes or extended!
            long readSoFar = (static_cast<long>(file.tellg()) - dp.second -
                              4); //4 is for "fmt "
            long leftToRead = wh->FormatSize - readSoFar;

            if (leftToRead == 0) { //Standard FMT read is complete
                //double check, if file is standard, now it should have reach to "data"
                file.read(&buff[0], 4);
                if (!wh->HasFact &&
                    string(&buff[0], 4) != WaveDataString) { //update error flag
                    wh->WarningFlags.set(
                            static_cast<int>(WARNING_NoneStandardExtension), 1);
                }
                return;
            } else if (leftToRead == 2) { //its fmt with 18 bytes
                file.read(reinterpret_cast<char*>(&wh->ExtensionSize),
                          sizeof(wh->ExtensionSize));
                file.read(&buff[0], 4);
                if (!wh->HasFact &&
                    string(&buff[0], 4) != WaveDataString) { //update error flag
                    wh->WarningFlags.set(
                            static_cast<int>(WARNING_NoneStandardExtension), 1);
                }
                return;
            }

            //standard extension sizes are 0 or 22 (0 is set by default in the struct)
            if (wh->ExtensionSize != 0 && wh->ExtensionSize != WaveStandartdExtSize) {
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);				
            } else if (wh->ExtensionSize == WaveStandartdExtSize) {
				file.read(reinterpret_cast<char*>(&wh->ValidBitsPerSample),
					sizeof(wh->ValidBitsPerSample)); //2
				file.read(reinterpret_cast<char*>(&wh->ChannelMask),
					sizeof(wh->ChannelMask)); //4
				file.read(reinterpret_cast<char*>(&wh->SubFormat[0]),
					sizeof(wh->SubFormat[0]) *
					(wh->ExtensionSize - 6)); //16 byte, [6 = 2 vbps, 4 cm]
			} else { //skip nonstandard extension to reach data...				
				file.ignore(wh->ExtensionSize);
			}
            //by reaching here the next 4 bytes should be "fact" (if it is available)
            // or "data" (other possibilities might exist!!!!)
            file.read(&buff[0], 4);
            if (!wh->HasFact &&
                string(&buff[0], 4) != WaveDataString) { //update error flag
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);
            }
        }